

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O2

void Open_JTalk_COPYRIGHT(void)

{
  fwrite("The Japanese TTS System \"Open JTalk\"\n",0x25,1,_stderr);
  fwrite("Version 1.10 (http://open-jtalk.sourceforge.net/)\n",0x32,1,_stderr);
  fwrite("Copyright (C) 2008-2016 Nagoya Institute of Technology\n",0x37,1,_stderr);
  fwrite("All rights reserved.\n",0x15,1,_stderr);
  fputc(10,_stderr);
  fputs("The HMM-Based Speech Synthesis Engine \"hts_engine API\"\nVersion 1.10 (http://hts-engine.sourceforge.net/)\nCopyright (C) 2001-2015 Nagoya Institute of Technology\n              2001-2008 Tokyo Institute of Technology\nAll rights reserved.\n"
        ,_stderr);
  fputc(10,_stderr);
  fwrite("Yet Another Part-of-Speech and Morphological Analyzer \"Mecab\"\n",0x3e,1,_stderr);
  fwrite("Version 0.996 (http://mecab.sourceforge.net/)\n",0x2e,1,_stderr);
  fwrite("Copyright (C) 2001-2008 Taku Kudo\n",0x22,1,_stderr);
  fwrite("              2004-2008 Nippon Telegraph and Telephone Corporation\n",0x43,1,_stderr);
  fwrite("All rights reserved.\n",0x15,1,_stderr);
  fputc(10,_stderr);
  fwrite("NAIST Japanese Dictionary\n",0x1a,1,_stderr);
  fwrite("Version 0.6.1-20090630 (http://naist-jdic.sourceforge.jp/)\n",0x3b,1,_stderr);
  fwrite("Copyright (C) 2009 Nara Institute of Science and Technology\n",0x3c,1,_stderr);
  fwrite("All rights reserved.\n",0x15,1,_stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

void Open_JTalk_COPYRIGHT()
{
	fprintf(stderr, "The Japanese TTS System \"Open JTalk\"\n");
	fprintf(stderr, "Version 1.10 (http://open-jtalk.sourceforge.net/)\n");
	fprintf(stderr, "Copyright (C) 2008-2016 Nagoya Institute of Technology\n");
	fprintf(stderr, "All rights reserved.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "%s", HTS_COPYRIGHT);
	fprintf(stderr, "\n");
	fprintf(stderr, "Yet Another Part-of-Speech and Morphological Analyzer \"Mecab\"\n");
	fprintf(stderr, "Version 0.996 (http://mecab.sourceforge.net/)\n");
	fprintf(stderr, "Copyright (C) 2001-2008 Taku Kudo\n");
	fprintf(stderr, "              2004-2008 Nippon Telegraph and Telephone Corporation\n");
	fprintf(stderr, "All rights reserved.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "NAIST Japanese Dictionary\n");
	fprintf(stderr, "Version 0.6.1-20090630 (http://naist-jdic.sourceforge.jp/)\n");
	fprintf(stderr, "Copyright (C) 2009 Nara Institute of Science and Technology\n");
	fprintf(stderr, "All rights reserved.\n");
	fprintf(stderr, "\n");
}